

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FieldOptions::Clear(FieldOptions *this)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  ulong uVar2;
  FeatureSet *this_01;
  FieldOptions_FeatureSupport *this_02;
  char *pcVar3;
  int iVar4;
  bool is_soo;
  LogMessageFatal local_30;
  
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  this_00 = &(this->field_0)._impl_.targets_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar2 & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  is_soo = (uVar2 & 4) == 0;
  internal::SooRep::size(&this_00->soo_rep_,is_soo);
  iVar4 = internal::SooRep::size(&this_00->soo_rep_,is_soo);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  RepeatedField<int>::set_size(this_00,(uVar2 & 4) == 0,0);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldOptions_EditionDefault>>
            (&(this->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
            (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this_01 = (this->field_0)._impl_.features_;
      if (this_01 == (FeatureSet *)0x0) {
        pcVar3 = "!value || _impl_.features_ != nullptr";
        iVar4 = 0x27b8;
        goto LAB_003d3f1b;
      }
      FeatureSet::Clear(this_01);
    }
    if ((uVar1 & 2) != 0) {
      this_02 = (this->field_0)._impl_.feature_support_;
      if (this_02 == (FieldOptions_FeatureSupport *)0x0) {
        pcVar3 = "!value || _impl_.feature_support_ != nullptr";
        iVar4 = 0x27bc;
LAB_003d3f1b:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,iVar4,pcVar3 + 10);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
      }
      FieldOptions_FeatureSupport::Clear(this_02);
    }
  }
  if ((uVar1 & 0xfc) != 0) {
    (this->field_0)._impl_.jstype_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x70) = 0;
  }
  if ((uVar1 & 0x700) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x7c) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FieldOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.targets_.Clear();
  _impl_.edition_defaults_.Clear();
  _impl_.uninterpreted_option_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.features_ != nullptr);
      _impl_.features_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.feature_support_ != nullptr);
      _impl_.feature_support_->Clear();
    }
  }
  if ((cached_has_bits & 0x000000fcu) != 0) {
    ::memset(&_impl_.ctype_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.jstype_) -
        reinterpret_cast<char*>(&_impl_.ctype_)) + sizeof(_impl_.jstype_));
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    ::memset(&_impl_.unverified_lazy_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.retention_) -
        reinterpret_cast<char*>(&_impl_.unverified_lazy_)) + sizeof(_impl_.retention_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}